

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O1

void Amap_LibWrite(FILE *pFile,Amap_Lib_t *pLib,int fPrintDsd)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  fprintf((FILE *)pFile,"# The genlib library \"%s\".\n",pLib->pName);
  pVVar1 = pLib->vGates;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      Amap_LibWriteGate(pFile,(Amap_Gat_t *)pVVar1->pArray[lVar2],fPrintDsd);
      lVar2 = lVar2 + 1;
      pVVar1 = pLib->vGates;
    } while (lVar2 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Amap_LibWrite( FILE * pFile, Amap_Lib_t * pLib, int fPrintDsd )
{
    Amap_Gat_t * pGate;
    int i;
    fprintf( pFile, "# The genlib library \"%s\".\n", pLib->pName );
    Amap_LibForEachGate( pLib, pGate, i )
        Amap_LibWriteGate( pFile, pGate, fPrintDsd );
}